

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContextUtil.cpp
# Opt level: O2

void sglr::drawQuadWithClientPointers(Context *ctx,deUint32 program,Vec3 *p0,Vec3 *p1)

{
  uint uVar1;
  uint uVar2;
  TestError *this;
  undefined4 in_register_00000034;
  deUint16 indices [6];
  undefined8 local_88;
  float local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  float local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  float local_60;
  undefined4 local_5c;
  undefined8 local_58;
  float local_50;
  undefined4 local_4c;
  float coord [8];
  
  local_80 = p0->m_data[2];
  local_50 = p1->m_data[2];
  local_88 = *(undefined8 *)p0->m_data;
  local_70 = (local_80 + local_50) * 0.5;
  local_7c = 0x3f800000;
  local_78 = (undefined4)local_88;
  local_6c = 0x3f800000;
  local_64 = (undefined4)((ulong)local_88 >> 0x20);
  local_5c = 0x3f800000;
  local_58 = *(undefined8 *)p1->m_data;
  local_68 = (undefined4)local_58;
  local_74 = (undefined4)((ulong)local_58 >> 0x20);
  local_4c = 0x3f800000;
  coord[4] = 1.0;
  coord[5] = 0.0;
  coord[6] = 1.0;
  coord[7] = 1.0;
  coord[0] = 0.0;
  coord[1] = 0.0;
  coord[2] = 0.0;
  coord[3] = 1.0;
  indices[0] = 0;
  indices[1] = 1;
  indices[2] = 2;
  indices[3] = 2;
  indices[4] = 1;
  indices[5] = 3;
  local_60 = local_70;
  uVar1 = (*ctx->_vptr_Context[0x59])(ctx,CONCAT44(in_register_00000034,program),"a_position");
  uVar2 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)program,"a_coord");
  (*ctx->_vptr_Context[0x76])(ctx);
  if (-1 < (int)uVar1) {
    (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar1);
    (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar1,4,0x1406,0,0,&local_88);
    if ((int)uVar2 < 0) {
      (*ctx->_vptr_Context[0x6a])(ctx,4,6,0x1403,indices);
    }
    else {
      (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar2);
      (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar2,2,0x1406,0,0,coord);
      (*ctx->_vptr_Context[0x6a])(ctx,4,6,0x1403,indices);
      (*ctx->_vptr_Context[0x51])(ctx,(ulong)uVar1);
      uVar1 = uVar2;
    }
    (*ctx->_vptr_Context[0x51])(ctx,(ulong)uVar1);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"posLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrContextUtil.cpp"
             ,0x8a);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void drawQuadWithClientPointers (sglr::Context& ctx, deUint32 program, const tcu::Vec3& p0, const tcu::Vec3& p1)
{
	// Vertex data.
	float hz = (p0.z() + p1.z()) * 0.5f;
	float position[] =
	{
		p0.x(), p0.y(), p0.z(),	1.0f,
		p0.x(), p1.y(), hz,		1.0f,
		p1.x(), p0.y(), hz,		1.0f,
		p1.x(), p1.y(), p1.z(),	1.0f
	};
	const float coord[] =
	{
		0.0f, 0.0f,
		0.0f, 1.0f,
		1.0f, 0.0f,
		1.0f, 1.0f
	};
	const deUint16	indices[]	= { 0, 1, 2, 2, 1, 3 };

	deInt32			posLoc		= ctx.getAttribLocation(program, "a_position");
	deInt32			coordLoc	= ctx.getAttribLocation(program, "a_coord");

	ctx.useProgram(program);
	TCU_CHECK(posLoc >= 0);
	{
		ctx.enableVertexAttribArray(posLoc);
		ctx.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
	}

	if (coordLoc >= 0)
	{
		ctx.enableVertexAttribArray(coordLoc);
		ctx.vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, &coord[0]);
	}

	ctx.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]);

	if (posLoc >= 0)
		ctx.disableVertexAttribArray(posLoc);

	if (coordLoc >= 0)
		ctx.disableVertexAttribArray(coordLoc);
}